

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

SMaterial * __thiscall irr::scene::CMeshSceneNode::getMaterial(CMeshSceneNode *this,u32 i)

{
  long lVar1;
  uint uVar2;
  u32 uVar3;
  undefined8 *puVar4;
  uint in_ESI;
  ISceneNode *in_RDI;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar5;
  ISceneNode *this_00;
  SMaterial *local_8;
  
  lVar1._0_4_ = in_RDI[1].DebugDataVisible;
  lVar1._4_1_ = in_RDI[1].IsVisible;
  lVar1._5_1_ = in_RDI[1].IsDebugObject;
  lVar1._6_2_ = *(undefined2 *)&in_RDI[1].field_0xde;
  uVar5 = in_ESI;
  if (((lVar1 != 0) && ((in_RDI[1].field_0xe4 & 1) != 0)) &&
     (this_00 = in_RDI, uVar2 = (**(code **)**(undefined8 **)&in_RDI[1].DebugDataVisible)(),
     in_stack_ffffffffffffffdc = in_ESI, in_ESI < uVar2)) {
    puVar4 = (undefined8 *)
             (**(code **)(**(long **)&in_RDI[1].DebugDataVisible + 8))
                       (*(long **)&in_RDI[1].DebugDataVisible,uVar5);
    (**(code **)*puVar4)();
    video::SMaterial::operator=
              ((SMaterial *)this_00,(SMaterial *)CONCAT44(uVar5,in_stack_ffffffffffffffe8));
    return (SMaterial *)
           ((long)&in_RDI[1].Name.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18);
  }
  uVar2 = uVar5;
  uVar3 = core::array<irr::video::SMaterial>::size((array<irr::video::SMaterial> *)0x2c407e);
  if (uVar5 < uVar3) {
    local_8 = core::array<irr::video::SMaterial>::operator[]
                        ((array<irr::video::SMaterial> *)in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    local_8 = ISceneNode::getMaterial(in_RDI,uVar2);
  }
  return local_8;
}

Assistant:

video::SMaterial &CMeshSceneNode::getMaterial(u32 i)
{
	if (Mesh && ReadOnlyMaterials && i < Mesh->getMeshBufferCount()) {
		ReadOnlyMaterial = Mesh->getMeshBuffer(i)->getMaterial();
		return ReadOnlyMaterial;
	}

	if (i >= Materials.size())
		return ISceneNode::getMaterial(i);

	return Materials[i];
}